

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReactiveDevice.cpp
# Opt level: O2

void __thiscall
Apple::ADB::ReactiveDevice::adb_bus_did_observe_event
          (ReactiveDevice *this,Event event,uint8_t value)

{
  int iVar1;
  pointer puVar2;
  Type TVar3;
  ushort *puVar4;
  Command CVar5;
  ushort uVar6;
  ushort *puVar7;
  initializer_list<unsigned_char> __l;
  uint8_t value_local;
  allocator_type local_2b;
  ushort local_2a;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_28;
  
  if (this->phase_ == AwaitingAttention) {
    if (event == Attention) {
      this->phase_ = AwaitingCommand;
    }
  }
  else if (event == Byte) {
    value_local = value;
    if (this->phase_ == AwaitingContent) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                (&this->content_,&value_local);
      puVar4 = (ushort *)
               (this->content_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      puVar7 = (ushort *)
               (this->content_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if ((long)puVar7 - (long)puVar4 == this->expected_content_size_) {
        this->phase_ = AwaitingAttention;
        if ((this->command_).reg == '\x03') {
          this->register3_ = *puVar4 << 8 | *puVar4 >> 8;
        }
        else {
          (*(this->super_Device)._vptr_Device[3])(this,&this->command_,&this->content_);
          puVar4 = (ushort *)
                   (this->content_).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          puVar7 = (ushort *)
                   (this->content_).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        }
        if (puVar7 != puVar4) {
          (this->content_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
          .super__Vector_impl_data._M_finish = (pointer)puVar4;
        }
      }
    }
    if (this->phase_ == AwaitingCommand) {
      this->phase_ = AwaitingAttention;
      CVar5 = decode_command(value_local);
      TVar3 = CVar5.type;
      (this->command_).type = TVar3;
      uVar6 = CVar5._4_2_;
      (this->command_).device = (char)uVar6;
      (this->command_).reg = (char)(uVar6 >> 8);
      if ((CVar5.device == 0xff) ||
         ((*(byte *)((long)&this->register3_ + 1) & 0xf) == (uVar6 & 0xff))) {
        if (TVar3 - Listen < 2) {
          if (((ulong)CVar5 & 0xff0000000000) == 0x30000000000) {
            if (TVar3 == Talk) {
              local_2a = this->register3_ << 8 | this->register3_ >> 8;
              __l._M_len = 2;
              __l._M_array = (iterator)&local_2a;
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_28,__l,
                         &local_2b);
              post_response(this,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_28)
              ;
              std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                        (&local_28);
              return;
            }
            puVar2 = (this->content_).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
            if ((this->content_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_finish != puVar2) {
              (this->content_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_finish = puVar2;
            }
            this->expected_content_size_ = 2;
            this->phase_ = AwaitingContent;
            return;
          }
          LOCK();
          (this->service_desired_)._M_base._M_i = false;
          UNLOCK();
        }
        else if (TVar3 == Reset) {
          iVar1._0_1_ = this->default_adb_device_id_;
          iVar1._1_1_ = this->service_desired_;
          iVar1._2_2_ = *(undefined2 *)&this->field_0x76;
          this->register3_ = (ushort)(iVar1 << 8) | 0x6001;
        }
        (*(this->super_Device)._vptr_Device[2])(this,&this->command_);
      }
      else if (((this->service_desired_)._M_base._M_i & 1U) != 0) {
        LOCK();
        (this->service_desired_)._M_base._M_i = false;
        UNLOCK();
        this->stop_has_begin_ = false;
        this->phase_ = ServiceRequestPending;
        this->microseconds_at_bit_ = 0.0;
      }
    }
  }
  return;
}

Assistant:

void ReactiveDevice::adb_bus_did_observe_event(Bus::Event event, uint8_t value) {
	if(phase_ == Phase::AwaitingAttention) {
		if(event != Bus::Event::Attention) return;
		phase_ = Phase::AwaitingCommand;
		return;
	}

	if(event != Bus::Event::Byte) return;

	if(phase_ == Phase::AwaitingContent) {
		content_.push_back(value);
		if(content_.size() == expected_content_size_) {
			phase_ = Phase::AwaitingAttention;

			if(command_.reg == 3) {
				register3_ = uint16_t((content_[0] << 8) | content_[1]);
			} else {
				did_receive_data(command_, content_);
			}
			content_.clear();
		}
	}

	if(phase_ == Phase::AwaitingCommand) {
		phase_ = Phase::AwaitingAttention;

		command_ = decode_command(value);
//		logger.info().append("%d", command_);

		// If this command doesn't apply here, but a service request is requested,
		// post a service request.
		if(command_.device != Command::AllDevices && command_.device != ((register3_ >> 8) & 0xf)) {
			if(service_desired_) {
				service_desired_ = false;
				stop_has_begin_ = false;
				phase_ = Phase::ServiceRequestPending;
				microseconds_at_bit_ = 0.0;
			}
			return;
		}

		// Handle reset and register 3 here automatically; pass everything else along.
		switch(command_.type) {
			case Command::Type::Reset:
				reset();
			[[fallthrough]];
			default:
				perform_command(command_);
			break;

			case Command::Type::Listen:
			case Command::Type::Talk:
				if(command_.reg == 3) {
					if(command_.type == Command::Type::Talk) {
						post_response({uint8_t(register3_ >> 8), uint8_t(register3_ & 0xff)});
					} else {
						receive_bytes(2);
					}
				} else {
					service_desired_ = false;
					perform_command(command_);
				}
			break;
		}
	}
}